

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>::walkFunctionInModule
          (Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_> *this,Function *func,
          Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::CodeUpdater::
  doWalkFunction(wasm::Function__(&this[-1].stack.fixed._M_elems[9].currp,func);
  Visitor<CodeUpdater,_void>::visitFunction((Visitor<CodeUpdater,_void> *)this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }